

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall TPZMatrix<float>::Identity(TPZMatrix<float> *this)

{
  _func_int **pp_Var1;
  undefined4 *puVar2;
  long lVar3;
  int64_t col;
  long lVar4;
  int64_t row;
  long lVar5;
  undefined4 local_30;
  undefined4 local_2c;
  
  if ((this->super_TPZBaseMatrix).fCol != (this->super_TPZBaseMatrix).fRow) {
    Error("identity (TPZMatrix<>*) <TPZMatrix<>must be square>",(char *)0x0);
  }
  for (lVar5 = 0; lVar5 < (this->super_TPZBaseMatrix).fRow; lVar5 = lVar5 + 1) {
    for (lVar4 = 0; lVar4 < (this->super_TPZBaseMatrix).fCol; lVar4 = lVar4 + 1) {
      if (lVar5 == lVar4) {
        local_2c = 0x3f800000;
        pp_Var1 = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable;
        puVar2 = &local_2c;
        lVar3 = lVar5;
      }
      else {
        local_30 = 0;
        pp_Var1 = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable;
        puVar2 = &local_30;
        lVar3 = lVar4;
      }
      (*pp_Var1[0x23])(this,lVar5,lVar3,puVar2);
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Identity() {
	
    if ( Cols() != Rows() ) {
        Error( "identity (TPZMatrix<>*) <TPZMatrix<>must be square>" );
    }
    for ( int64_t row = 0; row < Rows(); row++) {
        for ( int64_t col = 0; col < Cols(); col++ ) {
            (row == col)? PutVal(row,col,1.):PutVal(row,col,0.);
        }
    }
}